

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene-access.cc
# Opt level: O1

expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
tinyusdz::tydra::anon_unknown_6::GetPrimProperty<tinyusdz::UsdUVTexture>
          (expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,UsdUVTexture *tex,string *prop_name,Property *out_prop)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  double t;
  bool bVar3;
  int iVar4;
  const_iterator cVar5;
  ulong uVar6;
  long lVar7;
  PrimVar pvar;
  Value val;
  AssetPath a;
  string err;
  Attribute attr;
  optional<tinyusdz::Animatable<tinyusdz::value::AssetPath>_> aval;
  storage_union local_988;
  pointer local_978;
  undefined1 local_970;
  undefined1 local_968 [40];
  UsdUVTexture *local_940;
  expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_938;
  storage_union local_930;
  undefined1 *local_920;
  AssetPath local_918;
  undefined1 *local_8d8;
  undefined8 local_8d0;
  undefined1 local_8c8;
  undefined7 uStack_8c7;
  undefined1 local_8b8 [40];
  _Alloc_hider local_890;
  size_type local_888;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_880;
  storage_union local_870;
  vtable_type *local_860;
  bool local_858;
  undefined1 local_850 [32];
  undefined1 local_830 [24];
  AttrMetas AStack_818;
  undefined1 local_610 [8];
  undefined1 local_608 [32];
  string local_5e8 [32];
  undefined1 local_5c8 [16];
  pointer local_5b8;
  bool local_5b0;
  pointer local_5a8;
  pointer local_5a0;
  pointer local_598;
  bool local_590;
  pointer local_588;
  pointer local_580;
  pointer local_578;
  AttrMetas AStack_570;
  ListEditQual local_368;
  Type TStack_364;
  Type local_360;
  Path PStack_358;
  pointer local_288;
  pointer local_280;
  pointer local_278;
  ListEditQual local_270;
  AttrMetas AStack_268;
  bool local_60;
  string asStack_58 [32];
  bool local_38;
  
  local_8d8 = &local_8c8;
  local_8d0 = 0;
  local_8c8 = 0;
  iVar4 = ::std::__cxx11::string::compare((char *)prop_name);
  if (iVar4 == 0) {
    local_8b8._0_8_ = local_8b8 + 0x10;
    local_8b8._8_8_ = 0;
    local_8b8[0x10] = '\0';
    local_8b8[0x24] = false;
    local_890._M_p = (pointer)&local_880;
    local_888 = 0;
    local_880._M_local_buf[0] = '\0';
    local_860 = (vtable_type *)&linb::any::vtable_for_type<decltype(nullptr)>()::table;
    local_870.dynamic = (void *)0x0;
    local_858 = false;
    local_850._0_8_ = (pointer)0x0;
    local_850[8] = 0;
    local_850._9_7_ = 0;
    local_850[0x10] = 0;
    local_850._17_8_ = 0;
    AStack_818.interpolation.contained = (storage_t<tinyusdz::Interpolation>)0x0;
    AStack_818.elementSize.has_value_ = false;
    AStack_818.elementSize.contained = (storage_t<unsigned_int>)0x0;
    AStack_818.hidden.has_value_ = false;
    AStack_818.hidden.contained = (storage_t<bool>)0x0;
    AStack_818.comment.has_value_ = false;
    AStack_818.weight.contained = (storage_t<double>)0x0;
    AStack_818.connectability.has_value_ = false;
    AStack_818.bindMaterialAs.contained._16_8_ = 0;
    AStack_818.bindMaterialAs.contained._24_8_ = 0;
    AStack_818.bindMaterialAs.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
    AStack_818.bindMaterialAs.contained._8_8_ = 0;
    AStack_818.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &AStack_818.meta._M_t._M_impl.super__Rb_tree_header._M_header;
    AStack_818.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    AStack_818.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    AStack_818.comment.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
    AStack_818.comment.contained._8_8_ = 0;
    AStack_818.comment.contained._16_8_ = 0;
    AStack_818.comment.contained._24_8_ = 0;
    AStack_818.comment.contained._32_8_ = 0;
    AStack_818.comment.contained._40_8_ = 0;
    AStack_818.customData.has_value_ = false;
    AStack_818.customData.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
    AStack_818.customData.contained._8_8_ = 0;
    AStack_818.customData.contained._16_8_ = 0;
    AStack_818.customData.contained._24_8_ = 0;
    AStack_818.customData.contained._32_8_ = 0;
    AStack_818.customData.contained._40_8_ = 0;
    AStack_818.weight.has_value_ = false;
    AStack_818.connectability.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
    AStack_818.connectability.contained._8_8_ = 0;
    AStack_818.connectability.contained._16_8_ = 0;
    AStack_818.connectability.contained._24_8_ = 0;
    AStack_818.outputName.has_value_ = false;
    AStack_818.outputName.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
    AStack_818.outputName.contained._8_8_ = 0;
    AStack_818.outputName.contained._16_8_ = 0;
    AStack_818.outputName.contained._24_8_ = 0;
    AStack_818.renderType.has_value_ = false;
    AStack_818.sdrMetadata.has_value_ = false;
    AStack_818.renderType.contained._16_8_ = 0;
    AStack_818.renderType.contained._24_8_ = 0;
    AStack_818.renderType.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
    AStack_818.renderType.contained._8_8_ = 0;
    AStack_818.displayName.has_value_ = false;
    AStack_818.sdrMetadata.contained._32_8_ = 0;
    AStack_818.sdrMetadata.contained._40_8_ = 0;
    AStack_818.sdrMetadata.contained._16_8_ = 0;
    AStack_818.sdrMetadata.contained._24_8_ = 0;
    AStack_818.sdrMetadata.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
    AStack_818.sdrMetadata.contained._8_8_ = 0;
    AStack_818.displayGroup.has_value_ = false;
    AStack_818.displayName.contained._16_8_ = 0;
    AStack_818.displayName.contained._24_8_ = 0;
    AStack_818.displayName.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
    AStack_818.displayName.contained._8_8_ = 0;
    AStack_818.bindMaterialAs.has_value_ = false;
    AStack_818.displayGroup.contained._16_8_ = 0;
    AStack_818.displayGroup.contained._24_8_ = 0;
    AStack_818.displayGroup.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
    AStack_818.displayGroup.contained._8_8_ = 0;
    local_830[0x10] = 0;
    stack0xfffffffffffff7e1 = 0;
    local_830._0_8_ = (pointer)0x0;
    local_830[8] = 0;
    local_830._9_7_ = 0;
    AStack_818.meta._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    AStack_818.stringData.
    super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    AStack_818.stringData.
    super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    AStack_818.stringData.
    super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_8b8._32_4_ = Varying;
    local_608._8_4_ = 0x65737361;
    local_608._12_2_ = 0x74;
    local_608._0_8_ = (pointer)0x5;
    AStack_818.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         AStack_818.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    local_610 = (undefined1  [8])(local_608 + 8);
    ::std::__cxx11::string::_M_assign((string *)&local_890);
    if (local_610 != (undefined1  [8])(local_608 + 8)) {
      operator_delete((void *)local_610,
                      CONCAT26(local_608._14_2_,CONCAT24(local_608._12_2_,local_608._8_4_)) + 1);
    }
    if ((tex->file)._blocked == true) {
      local_858 = true;
    }
    if ((tex->file)._paths.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
        _M_impl.super__Vector_impl_data._M_finish !=
        (tex->file)._paths.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
        _M_impl.super__Vector_impl_data._M_start) {
      std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_830,
                 (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)&(tex->file)._paths);
    }
    local_978 = (pointer)&linb::any::vtable_for_type<decltype(nullptr)>()::table;
    local_988.dynamic = (void *)0x0;
    local_970 = 0;
    local_968._0_8_ = (pointer)0x0;
    local_968[8] = 0;
    local_968._9_7_ = 0;
    local_968[0x10] = 0;
    local_968._17_8_ = 0;
    bVar3 = (tex->file)._attrib.has_value_;
    local_610[0] = bVar3;
    if (bVar3 == true) {
      nonstd::optional_lite::detail::storage_t<tinyusdz::Animatable<tinyusdz::value::AssetPath>_>::
      construct_value((storage_t<tinyusdz::Animatable<tinyusdz::value::AssetPath>_> *)local_608,
                      (value_type *)&(tex->file)._attrib.contained);
    }
    local_938 = __return_storage_ptr__;
    if (local_610[0] == '\x01') {
      if ((bool)local_5c8[1] == true) {
        local_858 = true;
      }
      if ((bool)local_5c8[0] == true) {
        paVar1 = &local_918.asset_path_.field_2;
        local_918.asset_path_._M_string_length._0_1_ = 0;
        local_918.asset_path_._M_string_length._1_7_ = 0;
        local_918.asset_path_.field_2._M_local_buf[0] = '\0';
        paVar2 = &local_918.resolved_path_.field_2;
        local_918.resolved_path_._M_string_length = 0;
        local_918.resolved_path_.field_2._M_local_buf[0] = '\0';
        local_918.asset_path_._M_dataplus._M_p = (pointer)paVar1;
        local_918.resolved_path_._M_dataplus._M_p = (pointer)paVar2;
        bVar3 = Animatable<tinyusdz::value::AssetPath>::get_scalar
                          ((Animatable<tinyusdz::value::AssetPath> *)local_608,&local_918);
        if (bVar3) {
          local_920 = linb::any::vtable_for_type<tinyusdz::value::AssetPath>()::table;
          linb::any::do_construct<tinyusdz::value::AssetPath_const&,tinyusdz::value::AssetPath>
                    ((any *)&local_930,&local_918);
          linb::any::operator=((any *)&local_988,(any *)&local_930);
          if (local_920 != (undefined1 *)0x0) {
            (**(code **)(local_920 + 0x20))(&local_930);
            local_920 = (undefined1 *)0x0;
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_918.resolved_path_._M_dataplus._M_p != paVar2) {
          operator_delete(local_918.resolved_path_._M_dataplus._M_p,
                          CONCAT71(local_918.resolved_path_.field_2._M_allocated_capacity._1_7_,
                                   local_918.resolved_path_.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_918.asset_path_._M_dataplus._M_p != paVar1) {
          operator_delete(local_918.asset_path_._M_dataplus._M_p,
                          CONCAT71(local_918.asset_path_.field_2._M_allocated_capacity._1_7_,
                                   local_918.asset_path_.field_2._M_local_buf[0]) + 1);
        }
      }
      if (local_610[0] == '\0') {
LAB_00339838:
        __assert_fail("has_value()",
                      "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/nonstd/optional.hpp"
                      ,0x591,
                      "value_type &nonstd::optional_lite::optional<tinyusdz::Animatable<tinyusdz::value::AssetPath>>::value() [T = tinyusdz::Animatable<tinyusdz::value::AssetPath>]"
                     );
      }
      if (local_5a8._0_1_ == true) {
        TypedTimeSamples<tinyusdz::value::AssetPath>::update
                  ((TypedTimeSamples<tinyusdz::value::AssetPath> *)(local_5c8 + 8));
      }
      if (local_5b8 != (pointer)local_5c8._8_8_) {
        if (local_610[0] == '\0') goto LAB_00339838;
        local_940 = tex;
        if (local_5a8._0_1_ == true) {
          TypedTimeSamples<tinyusdz::value::AssetPath>::update
                    ((TypedTimeSamples<tinyusdz::value::AssetPath> *)(local_5c8 + 8));
        }
        local_918.asset_path_.field_2._M_local_buf[0] = '\0';
        local_918.asset_path_.field_2._M_allocated_capacity._1_7_ = 0;
        local_918.asset_path_.field_2._M_local_buf[8] = '\0';
        local_918.asset_path_._M_dataplus._M_p = (pointer)0x0;
        local_918.asset_path_._M_string_length._0_1_ = 0;
        local_918.asset_path_._M_string_length._1_7_ = 0;
        if (local_5b8 != (pointer)local_5c8._8_8_) {
          lVar7 = 8;
          uVar6 = 0;
          do {
            t = *(double *)((bool *)(local_5c8._8_8_ + -8) + lVar7);
            local_920 = linb::any::vtable_for_type<tinyusdz::value::AssetPath>()::table;
            linb::any::do_construct<tinyusdz::value::AssetPath_const&,tinyusdz::value::AssetPath>
                      ((any *)&local_930,(AssetPath *)(local_5c8._8_8_ + lVar7));
            tinyusdz::value::TimeSamples::add_sample
                      ((TimeSamples *)&local_918,t,(Value *)&local_930);
            if (local_920 != (undefined1 *)0x0) {
              (**(code **)(local_920 + 0x20))(&local_930);
              local_920 = (undefined1 *)0x0;
            }
            uVar6 = uVar6 + 1;
            lVar7 = lVar7 + 0x50;
          } while (uVar6 < (ulong)(((long)local_5b8 - local_5c8._8_8_ >> 4) * -0x3333333333333333));
        }
        ::std::
        vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
        ::operator=((vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                     *)local_968,
                    (vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                     *)&local_918);
        local_968[0x18] = local_918.asset_path_.field_2._M_local_buf[8];
        ::std::
        vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
        ::~vector((vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                   *)&local_918);
        tex = local_940;
      }
      if (local_610[0] == '\0') goto LAB_00339838;
      if ((bool)local_5c8[0] == false) {
        if (local_5a8._0_1_ == true) {
          TypedTimeSamples<tinyusdz::value::AssetPath>::update
                    ((TypedTimeSamples<tinyusdz::value::AssetPath> *)(local_5c8 + 8));
        }
        if (local_5b8 == (pointer)local_5c8._8_8_) goto LAB_003394b4;
      }
      Attribute::set_var((Attribute *)local_8b8,(PrimVar *)&local_988);
    }
LAB_003394b4:
    if (local_610[0] == '\x01') {
      nonstd::optional_lite::detail::storage_t<tinyusdz::Animatable<tinyusdz::value::AssetPath>_>::
      destruct_value((storage_t<tinyusdz::Animatable<tinyusdz::value::AssetPath>_> *)local_608);
    }
    ::std::
    vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
    ::~vector((vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
               *)local_968);
    if (local_978 != (pointer)0x0) {
      (**(code **)((long)local_978 + 0x20))(&local_988);
      local_978 = (pointer)0x0;
    }
    AttrMetas::operator=(&AStack_818,&(tex->file)._metas);
    Property::Property((Property *)local_610,(Attribute *)local_8b8,false);
    ::std::__cxx11::string::operator=((string *)out_prop,(string *)local_610);
    (out_prop->_attrib)._variability = local_608._24_4_;
    (out_prop->_attrib)._varying_authored = (bool)local_608[0x1c];
    ::std::__cxx11::string::operator=((string *)&(out_prop->_attrib)._type_name,local_5e8);
    linb::any::operator=((any *)&(out_prop->_attrib)._var,(any *)local_5c8);
    (out_prop->_attrib)._var._blocked = local_5b0;
    local_988.dynamic =
         (out_prop->_attrib)._var._ts._samples.
         super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_988._8_8_ =
         *(pointer *)
          ((long)&(out_prop->_attrib)._var._ts._samples.
                  super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                  ._M_impl.super__Vector_impl_data + 8);
    local_978 = *(pointer *)
                 ((long)&(out_prop->_attrib)._var._ts._samples.
                         super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                         ._M_impl.super__Vector_impl_data + 0x10);
    (out_prop->_attrib)._var._ts._samples.
    super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
    ._M_impl.super__Vector_impl_data._M_start = local_5a8;
    *(pointer *)
     ((long)&(out_prop->_attrib)._var._ts._samples.
             super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
             ._M_impl.super__Vector_impl_data + 8) = local_5a0;
    *(pointer *)
     ((long)&(out_prop->_attrib)._var._ts._samples.
             super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
             ._M_impl.super__Vector_impl_data + 0x10) = local_598;
    local_5a8 = (pointer)0x0;
    local_5a0 = (pointer)0x0;
    local_598 = (pointer)0x0;
    ::std::
    vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
    ::~vector((vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
               *)&local_988);
    (out_prop->_attrib)._var._ts._dirty = local_590;
    local_988.dynamic =
         (out_prop->_attrib)._paths.
         super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
         super__Vector_impl_data._M_start;
    local_988._8_8_ =
         (out_prop->_attrib)._paths.
         super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_978 = (out_prop->_attrib)._paths.
                super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
    (out_prop->_attrib)._paths.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
    _M_impl.super__Vector_impl_data._M_start = local_588;
    (out_prop->_attrib)._paths.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
    _M_impl.super__Vector_impl_data._M_finish = local_580;
    (out_prop->_attrib)._paths.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = local_578;
    local_588 = (pointer)0x0;
    local_580 = (pointer)0x0;
    local_578 = (pointer)0x0;
    ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::~vector
              ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)&local_988);
    AttrMetas::operator=(&(out_prop->_attrib)._metas,&AStack_570);
    out_prop->_listOpQual = local_368;
    out_prop->_type = TStack_364;
    (out_prop->_rel).type = local_360;
    Path::operator=(&(out_prop->_rel).targetPath,&PStack_358);
    local_988.dynamic =
         (out_prop->_rel).targetPathVector.
         super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
         super__Vector_impl_data._M_start;
    local_988._8_8_ =
         (out_prop->_rel).targetPathVector.
         super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_978 = (out_prop->_rel).targetPathVector.
                super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
    (out_prop->_rel).targetPathVector.
    super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
    super__Vector_impl_data._M_start = local_288;
    (out_prop->_rel).targetPathVector.
    super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
    super__Vector_impl_data._M_finish = local_280;
    (out_prop->_rel).targetPathVector.
    super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = local_278;
    local_288 = (pointer)0x0;
    local_280 = (pointer)0x0;
    local_278 = (pointer)0x0;
    ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::~vector
              ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)&local_988);
    (out_prop->_rel).listOpQual = local_270;
    AttrMetas::operator=(&(out_prop->_rel)._metas,&AStack_268);
    (out_prop->_rel)._varying_authored = local_60;
    ::std::__cxx11::string::operator=((string *)&out_prop->_prop_value_type_name,asStack_58);
    out_prop->_has_custom = local_38;
    Property::~Property((Property *)local_610);
    AttrMetas::~AttrMetas(&AStack_818);
    ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::~vector
              ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_830);
    ::std::
    vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
    ::~vector((vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
               *)local_850);
    if (local_860 != (vtable_type *)0x0) {
      (*local_860->destroy)(&local_870);
      local_860 = (vtable_type *)0x0;
    }
    __return_storage_ptr__ = local_938;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_890._M_p != &local_880) {
      operator_delete(local_890._M_p,
                      CONCAT71(local_880._M_allocated_capacity._1_7_,local_880._M_local_buf[0]) + 1)
      ;
    }
    if ((undefined1 *)local_8b8._0_8_ != local_8b8 + 0x10) {
      operator_delete((void *)local_8b8._0_8_,CONCAT71(local_8b8._17_7_,local_8b8[0x10]) + 1);
    }
  }
  else {
    cVar5 = ::std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
            ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                    *)&(tex->super_ShaderNode).super_UsdShadePrim.props,prop_name);
    if ((_Rb_tree_header *)cVar5._M_node ==
        &(tex->super_ShaderNode).super_UsdShadePrim.props._M_t._M_impl.super__Rb_tree_header) {
      (__return_storage_ptr__->contained).
      super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .m_has_value = true;
      (__return_storage_ptr__->contained).
      super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .field_0.m_value = false;
      goto LAB_00339806;
    }
    ::std::__cxx11::string::_M_assign((string *)out_prop);
    (out_prop->_attrib)._varying_authored = (bool)cVar5._M_node[3].field_0x4;
    (out_prop->_attrib)._variability = cVar5._M_node[3]._M_color;
    ::std::__cxx11::string::_M_assign((string *)&(out_prop->_attrib)._type_name);
    linb::any::operator=((any *)&(out_prop->_attrib)._var,(any *)&cVar5._M_node[4]._M_parent);
    (out_prop->_attrib)._var._blocked = SUB41(cVar5._M_node[5]._M_color,0);
    ::std::
    vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
    ::operator=(&(out_prop->_attrib)._var._ts._samples,
                (vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                 *)&cVar5._M_node[5]._M_parent);
    (out_prop->_attrib)._var._ts._dirty = SUB41(cVar5._M_node[6]._M_color,0);
    std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
              ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
               &(out_prop->_attrib)._paths,
               (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
               &cVar5._M_node[6]._M_parent);
    AttrMetas::operator=(&(out_prop->_attrib)._metas,(AttrMetas *)(cVar5._M_node + 7));
    *(_Base_ptr *)&out_prop->_listOpQual = cVar5._M_node[0x17]._M_parent;
    (out_prop->_rel).type = *(Type *)&cVar5._M_node[0x17]._M_left;
    Path::operator=(&(out_prop->_rel).targetPath,(Path *)&cVar5._M_node[0x17]._M_right);
    std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
              ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
               &(out_prop->_rel).targetPathVector,
               (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
               &cVar5._M_node[0x1e]._M_parent);
    (out_prop->_rel).listOpQual = cVar5._M_node[0x1f]._M_color;
    AttrMetas::operator=(&(out_prop->_rel)._metas,(AttrMetas *)&cVar5._M_node[0x1f]._M_parent);
    (out_prop->_rel)._varying_authored = *(bool *)&cVar5._M_node[0x2f]._M_left;
    ::std::__cxx11::string::_M_assign((string *)&out_prop->_prop_value_type_name);
    out_prop->_has_custom = *(bool *)&cVar5._M_node[0x30]._M_right;
  }
  (__return_storage_ptr__->contained).
  super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .m_has_value = true;
  (__return_storage_ptr__->contained).
  super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .field_0.m_value = true;
LAB_00339806:
  if (local_8d8 != &local_8c8) {
    operator_delete(local_8d8,CONCAT71(uStack_8c7,local_8c8) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

nonstd::expected<bool, std::string> GetPrimProperty(
    const UsdUVTexture &tex, const std::string &prop_name, Property *out_prop) {
  if (!out_prop) {
    return nonstd::make_unexpected(
        "[InternalError] nullptr in output Property is not allowed.");
  }

  DCOUT("prop_name = " << prop_name);
  std::string err;

  TO_PROPERTY("inputs:file", tex.file)

  {
    const auto it = tex.props.find(prop_name);
    if (it == tex.props.end()) {
      // Attribute not found.
      return false;
    }

    (*out_prop) = it->second;
  }

  return true;
}